

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowConstantAggregator::Finalize
          (WindowConstantAggregator *this,WindowAggregatorState *gstate,
          WindowAggregatorState *lstate,CollectionPtr collection,FrameStats *stats)

{
  idx_t *__mutex;
  idx_t *target;
  ArenaChunk **ppAVar1;
  type result;
  
  __mutex = &gstate[5].allocator.allocated_size;
  ::std::mutex::lock((mutex *)__mutex);
  target = &gstate[6].allocator.allocated_size;
  WindowAggregateStates::Combine
            ((WindowAggregateStates *)&lstate[4].allocator,(WindowAggregateStates *)target,0);
  WindowAggregateStates::Destroy((WindowAggregateStates *)&lstate[4].allocator);
  LOCK();
  ppAVar1 = &gstate[6].allocator.tail;
  *ppAVar1 = (ArenaChunk *)((long)&(*ppAVar1)[-1].prev + 7);
  UNLOCK();
  if (*ppAVar1 == (ArenaChunk *)0x0) {
    result = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        &gstate[0xc].allocator.arena_allocator.reallocate_function);
    WindowAggregateStates::Finalize((WindowAggregateStates *)target,result);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void WindowConstantAggregator::Finalize(WindowAggregatorState &gstate, WindowAggregatorState &lstate,
                                        CollectionPtr collection, const FrameStats &stats) {
	auto &gastate = gstate.Cast<WindowConstantAggregatorGlobalState>();
	auto &lastate = lstate.Cast<WindowConstantAggregatorLocalState>();

	//	Single-threaded combine
	lock_guard<mutex> finalize_guard(gastate.lock);
	lastate.statef.Combine(gastate.statef);
	lastate.statef.Destroy();

	if (!--gastate.locals) {
		gastate.statef.Finalize(*gastate.results);
	}
}